

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

bool mathiu::impl::
     lessC<std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::Product,mathiu::impl::Product>
               (Product *v1,Product *v2)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  
  p_Var4 = &(v1->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var4 != (v1->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    p_Var5 = &(v2->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      if (p_Var5 == (v2->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
      break;
      lVar2 = std::_Rb_tree_decrement(p_Var4);
      lVar3 = std::_Rb_tree_decrement(p_Var5);
      bVar1 = equal((ExprPtr *)(lVar2 + 0x30),(ExprPtr *)(lVar3 + 0x30));
      p_Var4 = (_Base_ptr)std::_Rb_tree_decrement(p_Var4);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
      if (!bVar1) {
        bVar1 = less((ExprPtr *)&p_Var4[1]._M_left,(ExprPtr *)&p_Var5[1]._M_left);
        return bVar1;
      }
    } while (p_Var4 != (v1->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  return (v1->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count <
         (v2->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

bool lessC(C1 const &v1, C2 const &v2)
    {
        auto i = std::rbegin(v1);
        auto j = std::rbegin(v2);
        for (; i != std::rend(v1) && j != std::rend(v2); ++i, ++j)
        {
            if (equal((*i), (*j)))
            {
                continue;
            }
            else
            {
                return less((*i), (*j));
            }
        }
        return v1.size() < v2.size();
    }